

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O1

void __thiscall burst::dynamic_tuple::pop_back(dynamic_tuple *this)

{
  pointer poVar1;
  pointer poVar2;
  size_t sVar3;
  size_t size;
  long local_20;
  
  poVar1 = (this->m_objects).
           super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar3 = 0;
  (*poVar1[-1].manage)
            (destroy,(void *)0x0,
             (this->m_data)._M_t.
             super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
             super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
             super__Head_base<0UL,_signed_char_*,_false>._M_head_impl + poVar1[-1].offset);
  poVar1 = (this->m_objects).
           super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = (this->m_objects).
           super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_objects).
  super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = poVar2 + -1;
  if (poVar1 != poVar2 + -1) {
    sVar3 = poVar2[-2].offset;
    (*poVar2[-2].manage)(size,(void *)0x0,&local_20);
    sVar3 = sVar3 + local_20;
  }
  this->m_volume = sVar3;
  return;
}

Assistant:

void pop_back ()
        {
            management::destroy(m_objects.back(), data());
            m_objects.pop_back();

            if (not m_objects.empty())
            {
                auto offset = m_objects.back().offset;
                auto size = management::size_of(m_objects.back());

                m_volume = offset + size;
            }
            else
            {
                m_volume = 0;
            }
        }